

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O3

arg_t * SEM_Args(ast *node)

{
  arg_t *paVar1;
  ast *paVar2;
  attr *paVar3;
  arg_t *paVar4;
  
  paVar1 = (arg_t *)malloc(0x10);
  paVar2 = child(node,1);
  paVar3 = SEM_Exp(paVar2);
  paVar1->arg = paVar3;
  paVar2 = child(node,3);
  if (paVar2 == (ast *)0x0) {
    paVar4 = (arg_t *)0x0;
  }
  else {
    paVar4 = SEM_Args(paVar2);
  }
  paVar1->next = paVar4;
  return paVar1;
}

Assistant:

struct arg_t *SEM_Args(struct ast *node) {
    struct arg_t *a = malloc(sizeof(struct arg_t));
    a->arg = SEM_Exp(child(node, 1));
    struct ast *child3 = child(node, 3);
    if (child3)
        a->next = SEM_Args(child3);
    else
        a->next = NULL;
    return a;
}